

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O2

void __thiscall imrt::ACS::search(ACS *this,int max_eval)

{
  ApertureILS *this_00;
  Plan *P;
  ostream *poVar1;
  EVP_PKEY_CTX *src;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  iVar2 = 1;
  iVar3 = 0;
  while ((this->super_ACO).n_ants + iVar3 <= max_eval) {
    (*(this->super_ACO)._vptr_ACO[2])(this);
    this_00 = (this->super_ACO).ils;
    P = Ant::getPlan((this->super_ACO).iteration_best);
    ApertureILS::simpleLocalSearch(this_00,P,false);
    Ant::generateReference((this->super_ACO).iteration_best);
    iVar3 = iVar3 + (this->super_ACO).n_ants;
    dVar4 = Ant::getEvaluation((this->super_ACO).global_best);
    dVar5 = Ant::getEvaluation((this->super_ACO).iteration_best);
    if (dVar5 < dVar4) {
      Ant::copy((this->super_ACO).global_best,(EVP_PKEY_CTX *)(this->super_ACO).iteration_best,src);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
    poVar1 = std::operator<<(poVar1," n_evals: ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar3);
    std::operator<<(poVar1," iter_best: ");
    dVar4 = Ant::getEvaluation((this->super_ACO).iteration_best);
    poVar1 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar1," global_best: ");
    dVar4 = Ant::getEvaluation((this->super_ACO).global_best);
    poVar1 = std::ostream::_M_insert<double>(dVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    ACO::evaporation(&this->super_ACO);
    ACO::globalDeposit(&this->super_ACO,(this->super_ACO).global_best);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void ACS::search(int max_eval) {
    int current_eval = 0;
    int iteration = 1;
    while ( (current_eval+ n_ants) <= max_eval) {
      generateTours();
      
      ils->simpleLocalSearch (*(iteration_best->getPlan()), false);
      iteration_best->generateReference();
      
      current_eval = current_eval + n_ants;
      if (global_best->getEvaluation() > iteration_best->getEvaluation())
        global_best->copy(*iteration_best);
      cout << "Iteration: " << iteration << " n_evals: "<< current_eval <<
          " iter_best: " << iteration_best->getEvaluation() <<
          " global_best: " << global_best->getEvaluation()<<endl;
      //iteration_best->printIntensities();
      evaporation();
      globalDeposit(global_best);
      iteration++;
      //printPheromone();
    }
     
  }